

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O3

bool __thiscall ami_nvar_t::nvar_entry_body_t::_is_null_guid(nvar_entry_body_t *this)

{
  pointer pcVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = (this->m_guid)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->m_guid)._M_string_length);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return this->n_guid;
}

Assistant:

bool _is_null_guid() { guid(); return n_guid; }